

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_objects.cc
# Opt level: O0

int __thiscall
QPDF::processXRefSize
          (QPDF *this,QPDFObjectHandle *dict,int entry_size,
          function<QPDFExc_(std::basic_string_view<char,_std::char_traits<char>_>)> *damaged)

{
  bool bVar1;
  longlong lVar2;
  QPDFExc *pQVar3;
  basic_string_view<char,_std::char_traits<char>_> local_f0;
  basic_string_view<char,_std::char_traits<char>_> local_e0;
  basic_string_view<char,_std::char_traits<char>_> local_d0;
  allocator<char> local_b9;
  string local_b8 [32];
  QPDFObjectHandle local_98;
  long local_88;
  longlong size;
  allocator<char> local_69;
  string local_68 [32];
  undefined1 local_48 [8];
  QPDFObjectHandle Size_obj;
  int local_2c;
  int max_num_entries;
  function<QPDFExc_(std::basic_string_view<char,_std::char_traits<char>_>)> *damaged_local;
  int entry_size_local;
  QPDFObjectHandle *dict_local;
  QPDF *this_local;
  
  local_2c = std::numeric_limits<int>::max();
  lVar2 = std::numeric_limits<long_long>::max();
  if (lVar2 / (long)entry_size < (long)local_2c) {
    lVar2 = std::numeric_limits<long_long>::max();
    Size_obj.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(lVar2 / (long)entry_size);
    local_2c = toI<long_long>((longlong *)
                              &Size_obj.super_BaseHandle.obj.
                               super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
                               _M_refcount);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_68,"/Size",&local_69);
  QPDFObjectHandle::getKey((QPDFObjectHandle *)local_48,(string *)dict);
  std::__cxx11::string::~string(local_68);
  std::allocator<char>::~allocator(&local_69);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_b8,"/Size",&local_b9);
  QPDFObjectHandle::getKey(&local_98,(string *)dict);
  bVar1 = QPDFObjectHandle::getValueAsInt(&local_98,&local_88);
  QPDFObjectHandle::~QPDFObjectHandle(&local_98);
  std::__cxx11::string::~string(local_b8);
  std::allocator<char>::~allocator(&local_b9);
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    pQVar3 = (QPDFExc *)__cxa_allocate_exception(0x80);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_d0,"Cross-reference stream does not have a proper /Size key");
    std::function<QPDFExc_(std::basic_string_view<char,_std::char_traits<char>_>)>::operator()
              (pQVar3,damaged,local_d0);
    __cxa_throw(pQVar3,&QPDFExc::typeinfo,QPDFExc::~QPDFExc);
  }
  if (local_88 < 0) {
    pQVar3 = (QPDFExc *)__cxa_allocate_exception(0x80);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_e0,"Cross-reference stream has a negative /Size key");
    std::function<QPDFExc_(std::basic_string_view<char,_std::char_traits<char>_>)>::operator()
              (pQVar3,damaged,local_e0);
    __cxa_throw(pQVar3,&QPDFExc::typeinfo,QPDFExc::~QPDFExc);
  }
  if (local_2c <= local_88) {
    pQVar3 = (QPDFExc *)__cxa_allocate_exception(0x80);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_f0,"Cross-reference stream has an impossibly large /Size key");
    std::function<QPDFExc_(std::basic_string_view<char,_std::char_traits<char>_>)>::operator()
              (pQVar3,damaged,local_f0);
    __cxa_throw(pQVar3,&QPDFExc::typeinfo,QPDFExc::~QPDFExc);
  }
  QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)local_48);
  return local_2c;
}

Assistant:

int
QPDF::processXRefSize(
    QPDFObjectHandle& dict, int entry_size, std::function<QPDFExc(std::string_view)> damaged)
{
    // Number of entries is limited by the highest possible object id and stream size.
    auto max_num_entries = std::numeric_limits<int>::max();
    if (max_num_entries > (std::numeric_limits<qpdf_offset_t>::max() / entry_size)) {
        max_num_entries = toI(std::numeric_limits<qpdf_offset_t>::max() / entry_size);
    }

    auto Size_obj = dict.getKey("/Size");
    long long size;
    if (!dict.getKey("/Size").getValueAsInt(size)) {
        throw damaged("Cross-reference stream does not have a proper /Size key");
    } else if (size < 0) {
        throw damaged("Cross-reference stream has a negative /Size key");
    } else if (size >= max_num_entries) {
        throw damaged("Cross-reference stream has an impossibly large /Size key");
    }
    // We are not validating that Size <= (Size key of parent xref / trailer).
    return max_num_entries;
}